

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O2

void run_init(wchar_t dir)

{
  byte bVar1;
  byte bVar2;
  loc grid;
  loc grid_00;
  player *ppVar3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  _Bool _Var7;
  wchar_t wVar8;
  loc lVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  
  ppVar3 = player;
  player->upkeep->running_firststep = true;
  run_cur_dir = dir;
  run_old_dir = dir;
  wVar8 = level_topography((int)ppVar3->place);
  if ((wVar8 != L'\a') && (wVar8 = level_topography((int)player->place), wVar8 != L'\0')) {
    return;
  }
  run_open_area = 1;
  run_break_right = '\0';
  run_break_left = '\0';
  lVar9 = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[dir]);
  uVar10 = (ulong)""[dir];
  bVar1 = "\x01\x02\x03\x06\t\b\a\x04\x01\x02\x03\x06\t\b\a\x04\x01"[uVar10 + 1];
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  _Var4 = see_wall((uint)bVar1,grid);
  if ((_Var4) || (_Var5 = see_wall((uint)bVar1,lVar9), _Var5)) {
    bVar12 = !_Var4;
    run_break_left = '\x01';
  }
  else {
    bVar12 = false;
  }
  bVar2 = (&DAT_00224caf)[uVar10];
  grid_00.x = (player->grid).x;
  grid_00.y = (player->grid).y;
  _Var5 = see_wall((uint)bVar2,grid_00);
  if (!_Var5) {
    _Var6 = see_wall((uint)bVar2,lVar9);
    _Var7 = true;
    if (!_Var6) goto LAB_001b0a73;
  }
  run_break_right = '\x01';
  _Var7 = _Var5;
LAB_001b0a73:
  wVar8 = run_old_dir;
  if ((run_break_left == '\x01') && (run_break_right == '\x01')) {
    run_open_area = 0;
    if ((dir & 1U) == 0) {
      lVar9.x = (player->grid).x;
      lVar9.y = (player->grid).y;
      _Var7 = see_wall((uint)"\x01\x02\x03\x06\t\b\a\x04\x01\x02\x03\x06\t\b\a\x04\x01"[uVar10],
                       lVar9);
      if (!_Var7) {
        return;
      }
      if (_Var4 && !_Var5) {
        lVar11 = uVar10 - 2;
      }
      else {
        if (_Var4 || !_Var5) {
          return;
        }
        lVar11 = uVar10 + 2;
      }
      wVar8 = (uint)"\x01\x02\x03\x06\t\b\a\x04\x01\x02\x03\x06\t\b\a\x04\x01"[lVar11];
    }
    else {
      wVar8 = (uint)bVar2;
      if (((bVar12 & _Var7) == 0) && (wVar8 = (uint)bVar1, bVar12 != false || _Var7 != false)) {
        run_open_area = 0;
        return;
      }
    }
  }
  run_old_dir = wVar8;
  return;
}

Assistant:

static void run_init(int dir)
{
	int i;
	struct loc grid;

	bool deepleft, deepright;
	bool shortleft, shortright;

	/* Mark that we're starting a run */
	player->upkeep->running_firststep = true;

	/* Save the direction */
	run_cur_dir = dir;

	/* Assume running straight */
	run_old_dir = dir;

	/* If it's wilderness, done -NRM- */
	if ((level_topography(player->place) != TOP_CAVE) &&
		(level_topography(player->place) != TOP_TOWN))
		return;

	/* Assume looking for open area */
	run_open_area = true;

	/* Assume not looking for breaks */
	run_break_right = false;
	run_break_left = false;

	/* Assume no nearby walls */
	deepleft = deepright = false;
	shortright = shortleft = false;

	/* Find the destination grid */
	grid = loc_sum(player->grid, ddgrid[dir]);

	/* Extract cycle index */
	i = chome[dir];

	/* Check for nearby or distant wall */
	if (see_wall(cycle[i + 1], player->grid)) {
		/* Wall diagonally left of player's current grid */
		run_break_left = true;
		shortleft = true;
	} else if (see_wall(cycle[i + 1], grid)) {
		/* Wall diagonally left of the grid the player is stepping to */
		run_break_left = true;
		deepleft = true;
	}

	/* Check for nearby or distant wall */
	if (see_wall(cycle[i - 1], player->grid)) {
		/* Wall diagonally right of player's current grid */
		run_break_right = true;
		shortright = true;
	} else if (see_wall(cycle[i - 1], grid)) {
		/* Wall diagonally right of the grid the player is stepping to */
		run_break_right = true;
		deepright = true;
	}

	/* Looking for a break */
	if (run_break_left && run_break_right) {
		/* Not looking for open area */
		run_open_area = false;

		/* Check angled or blunt corridor entry for diagonal directions */
		if (dir & 0x01) {
			if (deepleft && !deepright)
				run_old_dir = cycle[i - 1];
			else if (deepright && !deepleft)
				run_old_dir = cycle[i + 1];
		} else if (see_wall(cycle[i], player->grid)) {
			if (shortleft && !shortright)
				run_old_dir = cycle[i - 2];
			else if (shortright && !shortleft)
				run_old_dir = cycle[i + 2];
		}
	}
}